

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PhysicalDevice.cpp
# Opt level: O0

void __thiscall
myvk::PhysicalDevice::PhysicalDevice
          (PhysicalDevice *this,Ptr<Instance> *instance,VkPhysicalDevice physical_device)

{
  PFN_vkEnumerateDeviceExtensionProperties p_Var1;
  bool bVar2;
  VkQueueFamilyProperties *pVVar3;
  VkExtensionProperties *pVVar4;
  VkPhysicalDevice in_RDX;
  undefined8 *in_RDI;
  VkExtensionProperties *e;
  iterator __end2;
  iterator __begin2;
  vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *__range2;
  vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> extensions;
  uint32_t count_1;
  uint32_t count;
  VkPhysicalDeviceProperties2 properties2;
  VkPhysicalDeviceFeatures2 features2;
  vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *in_stack_fffffffffffffa78;
  undefined4 in_stack_fffffffffffffa80;
  uint32_t in_stack_fffffffffffffa84;
  PhysicalDeviceProperties *in_stack_fffffffffffffa90;
  size_type in_stack_fffffffffffffa98;
  vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *in_stack_fffffffffffffaa0;
  VkPhysicalDevice __a;
  key_type *__k;
  VkPhysicalDeviceProperties2 *this_00;
  undefined8 *local_500;
  void *local_4d0;
  allocator<char> local_4c1 [33];
  PhysicalDeviceProperties *local_4a0;
  VkExtensionProperties *local_498;
  __normal_iterator<VkExtensionProperties_*,_std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>_>
  local_490;
  undefined1 *local_488;
  undefined1 local_480 [24];
  uint32_t local_468;
  uint32_t local_464;
  VkPhysicalDeviceProperties2 local_460;
  VkPhysicalDeviceFeatures2 local_118;
  VkPhysicalDevice local_18;
  
  local_18 = in_RDX;
  Base::Base((Base *)CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80));
  *in_RDI = &PTR__PhysicalDevice_00530550;
  std::shared_ptr<myvk::Instance>::shared_ptr((shared_ptr<myvk::Instance> *)0x2c0ddb);
  in_RDI[5] = 0;
  *(undefined4 *)(in_RDI + 6) = 0;
  local_4d0 = (void *)((long)in_RDI + 0x34);
  memset(local_4d0,0,0x100);
  do {
    local_4d0 = (void *)((long)local_4d0 + 8);
  } while (local_4d0 != (void *)((long)in_RDI + 0x134));
  *(undefined4 *)((long)in_RDI + 0x134) = 0;
  local_500 = in_RDI + 0x27;
  memset(local_500,0,0x100);
  do {
    local_500 = local_500 + 2;
  } while (local_500 != in_RDI + 0x47);
  PhysicalDeviceFeatures::PhysicalDeviceFeatures((PhysicalDeviceFeatures *)(in_RDI + 0x47));
  PhysicalDeviceProperties::PhysicalDeviceProperties(in_stack_fffffffffffffa90);
  std::vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>::vector
            ((vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_> *)0x2c0f07);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
         *)0x2c0f20);
  std::shared_ptr<myvk::Instance>::operator=
            ((shared_ptr<myvk::Instance> *)
             CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
             (shared_ptr<myvk::Instance> *)in_stack_fffffffffffffa78);
  in_RDI[5] = local_18;
  (*vkGetPhysicalDeviceMemoryProperties)(local_18,(VkPhysicalDeviceMemoryProperties *)(in_RDI + 6));
  local_118.features.sparseResidencyAliased = 0;
  local_118.features.variableMultisampleRate = 0;
  local_118.features.inheritedQueries = 0;
  local_118._236_4_ = 0;
  local_118.features.sparseResidency2Samples = 0;
  local_118.features.sparseResidency4Samples = 0;
  local_118.features.sparseResidency8Samples = 0;
  local_118.features.sparseResidency16Samples = 0;
  local_118.features.sparseBinding = 0;
  local_118.features.sparseResidencyBuffer = 0;
  local_118.features.sparseResidencyImage2D = 0;
  local_118.features.sparseResidencyImage3D = 0;
  local_118.features.shaderInt64 = 0;
  local_118.features.shaderInt16 = 0;
  local_118.features.shaderResourceResidency = 0;
  local_118.features.shaderResourceMinLod = 0;
  local_118.features.shaderStorageImageArrayDynamicIndexing = 0;
  local_118.features.shaderClipDistance = 0;
  local_118.features.shaderCullDistance = 0;
  local_118.features.shaderFloat64 = 0;
  local_118.features.shaderStorageImageWriteWithoutFormat = 0;
  local_118.features.shaderUniformBufferArrayDynamicIndexing = 0;
  local_118.features.shaderSampledImageArrayDynamicIndexing = 0;
  local_118.features.shaderStorageBufferArrayDynamicIndexing = 0;
  local_118.features.shaderImageGatherExtended = 0;
  local_118.features.shaderStorageImageExtendedFormats = 0;
  local_118.features.shaderStorageImageMultisample = 0;
  local_118.features.shaderStorageImageReadWithoutFormat = 0;
  local_118.features.pipelineStatisticsQuery = 0;
  local_118.features.vertexPipelineStoresAndAtomics = 0;
  local_118.features.fragmentStoresAndAtomics = 0;
  local_118.features.shaderTessellationAndGeometryPointSize = 0;
  local_118.features.textureCompressionETC2 = 0;
  local_118.features.textureCompressionASTC_LDR = 0;
  local_118.features.textureCompressionBC = 0;
  local_118.features.occlusionQueryPrecise = 0;
  local_118.features.largePoints = 0;
  local_118.features.alphaToOne = 0;
  local_118.features.multiViewport = 0;
  local_118.features.samplerAnisotropy = 0;
  local_118.features.depthBiasClamp = 0;
  local_118.features.fillModeNonSolid = 0;
  local_118.features.depthBounds = 0;
  local_118.features.wideLines = 0;
  local_118.features.logicOp = 0;
  local_118.features.multiDrawIndirect = 0;
  local_118.features.drawIndirectFirstInstance = 0;
  local_118.features.depthClamp = 0;
  local_118.features.geometryShader = 0;
  local_118.features.tessellationShader = 0;
  local_118.features.sampleRateShading = 0;
  local_118.features.dualSrcBlend = 0;
  local_118.features.robustBufferAccess = 0;
  local_118.features.fullDrawIndexUint32 = 0;
  local_118.features.imageCubeArray = 0;
  local_118.features.independentBlend = 0;
  local_118.sType = VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FEATURES_2;
  local_118._4_4_ = 0;
  local_118.pNext = in_RDI + 99;
  (*vkGetPhysicalDeviceFeatures2)(local_18,&local_118);
  memcpy(in_RDI + 0x47,&local_118.features,0xdc);
  this_00 = &local_460;
  memset(this_00,0,0x348);
  local_460.sType = VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_PROPERTIES_2;
  local_460.pNext = in_RDI + 0xf6;
  (*vkGetPhysicalDeviceProperties2)(local_18,this_00);
  memcpy(in_RDI + 0x8f,&local_460.properties,0x338);
  (*vkGetPhysicalDeviceQueueFamilyProperties)(local_18,&local_464,(VkQueueFamilyProperties *)0x0);
  std::vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>::resize
            ((vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_> *)
             in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98);
  __a = local_18;
  __k = (key_type *)vkGetPhysicalDeviceQueueFamilyProperties;
  pVVar3 = std::vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>::data
                     ((vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_> *)
                      0x2c112e);
  (*(code *)__k)(__a,&local_464,pVVar3);
  std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>::vector
            ((vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *)0x2c1154);
  (*vkEnumerateDeviceExtensionProperties)
            (local_18,(char *)0x0,&local_468,(VkExtensionProperties *)0x0);
  std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>::resize
            (in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98);
  p_Var1 = vkEnumerateDeviceExtensionProperties;
  pVVar4 = std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>::data
                     ((vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *)
                      0x2c11b8);
  (*p_Var1)(local_18,(char *)0x0,&local_468,pVVar4);
  local_488 = local_480;
  local_490._M_current =
       (VkExtensionProperties *)
       std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>::begin
                 (in_stack_fffffffffffffa78);
  local_498 = (VkExtensionProperties *)
              std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>::end
                        (in_stack_fffffffffffffa78);
  while( true ) {
    bVar2 = __gnu_cxx::
            operator==<VkExtensionProperties_*,_std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>_>
                      ((__normal_iterator<VkExtensionProperties_*,_std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>_>
                        *)CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
                       (__normal_iterator<VkExtensionProperties_*,_std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>_>
                        *)in_stack_fffffffffffffa78);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    in_stack_fffffffffffffa90 =
         (PhysicalDeviceProperties *)
         __gnu_cxx::
         __normal_iterator<VkExtensionProperties_*,_std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>_>
         ::operator*(&local_490);
    in_stack_fffffffffffffa84 = *(uint32_t *)((in_stack_fffffffffffffa90->vk10).deviceName + 0xec);
    local_4a0 = in_stack_fffffffffffffa90;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
               (char *)__k,(allocator<char> *)__a);
    in_stack_fffffffffffffa78 =
         (vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                       *)this_00,__k);
    *(uint32_t *)
     &(in_stack_fffffffffffffa78->
      super__Vector_base<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>)._M_impl.
      super__Vector_impl_data._M_start = in_stack_fffffffffffffa84;
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80));
    std::allocator<char>::~allocator(local_4c1);
    __gnu_cxx::
    __normal_iterator<VkExtensionProperties_*,_std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>_>
    ::operator++(&local_490);
  }
  std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>::~vector
            ((vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *)
             in_stack_fffffffffffffa90);
  return;
}

Assistant:

PhysicalDevice::PhysicalDevice(const Ptr<Instance> &instance, VkPhysicalDevice physical_device) {
	m_instance_ptr = instance;
	m_physical_device = physical_device;
	vkGetPhysicalDeviceMemoryProperties(physical_device, &m_memory_properties);
	{
		VkPhysicalDeviceFeatures2 features2{VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FEATURES_2, &m_features.vk11};
		vkGetPhysicalDeviceFeatures2(physical_device, &features2);
		m_features.vk10 = features2.features;
	}
	{
		VkPhysicalDeviceProperties2 properties2{VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_PROPERTIES_2, &m_properties.vk11};
		vkGetPhysicalDeviceProperties2(physical_device, &properties2);
		m_properties.vk10 = properties2.properties;
	}
	{
		uint32_t count;
		vkGetPhysicalDeviceQueueFamilyProperties(physical_device, &count, nullptr);
		m_queue_family_properties.resize(count);
		vkGetPhysicalDeviceQueueFamilyProperties(physical_device, &count, m_queue_family_properties.data());
	}
	{
		uint32_t count;
		std::vector<VkExtensionProperties> extensions;
		vkEnumerateDeviceExtensionProperties(physical_device, nullptr, &count, nullptr);
		extensions.resize(count);
		vkEnumerateDeviceExtensionProperties(physical_device, nullptr, &count, extensions.data());
		for (const auto &e : extensions)
			m_extensions[e.extensionName] = e.specVersion;
	}
}